

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  int iVar5;
  time_t tVar6;
  int iVar7;
  int iVar8;
  double local_58;
  double local_48;
  double dStack_20;
  
  iVar8 = 0;
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  dVar1 = 1.0;
  local_58 = 0.0;
  iVar7 = 100;
  do {
    iVar5 = rand();
    dVar3 = ((double)iVar5 / 2147483647.0 + -0.5) * 0.5;
    local_48 = dVar3 + dVar3 + local_58;
    dVar3 = local_58 * 0.5 * local_58;
    dVar4 = local_48 * 0.5 * local_48;
    auVar2._8_4_ = SUB84(dVar4,0);
    auVar2._0_8_ = dVar3;
    auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
    iVar5 = rand();
    dStack_20 = auVar2._8_8_;
    dVar3 = exp(dVar3 - dStack_20);
    if (dVar3 <= (double)iVar5 / 2147483647.0) {
      local_48 = local_58;
    }
    iVar8 = iVar8 + (uint)((double)iVar5 / 2147483647.0 < dVar3);
    printf("%.10f\t%f\n",local_48._0_4_,SUB84((double)iVar8 / dVar1,0));
    dVar1 = dVar1 + 1.0;
    local_58 = local_48;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  return 0;
}

Assistant:

int main(void) {
    int niter = 100; // サンプルの数
    double step_size = 0.5e0;
    srand((unsigned) time(nullptr));

    double x = 0e0;
    int naccept = 0; // 受理回数カウンター

    for (int iter = 1; iter < niter + 1; iter++) {
        double backup_x = x;
        double action_init = 0.5e0 * x * x;

        double dx = (double) rand() / RAND_MAX;
        dx = (dx - 0.5e0) * step_size * 2e0;
        x += dx;

        double action_fin = 0.5e0 * x * x;

        // メトロポリステスト
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(action_init - action_fin) > metropolis) {
            // 受理
            naccept++;
        } else {
            // 棄却して元に戻す
            x = backup_x;
        }
        printf("%.10f\t%f\n", x, (double) naccept / iter);
    }
}